

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableWidget::setItem(QTableWidget *this,int row,int column,QTableWidgetItem *item)

{
  QTableWidgetPrivate *this_00;
  QTableModel *this_01;
  QTableWidgetItem *pQVar1;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QTableWidgetItem *)0x0) {
    pQVar1 = takeItem(this,row,column);
    if (pQVar1 != (QTableWidgetItem *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        (*pQVar1->_vptr_QTableWidgetItem[1])(pQVar1);
        return;
      }
      goto LAB_00535a56;
    }
  }
  else {
    if (item->view == (QTableWidget *)0x0) {
      this_00 = *(QTableWidgetPrivate **)
                 &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
                  super_QFrame.super_QWidget.field_0x8;
      item->view = this;
      this_01 = QTableWidgetPrivate::tableModel(this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QTableModel::setItem(this_01,row,column,item);
        return;
      }
      goto LAB_00535a56;
    }
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_28 = "default";
    QMessageLogger::warning
              (local_40,
               "QTableWidget: cannot insert an item that is already owned by another QTableWidget");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_00535a56:
  __stack_chk_fail();
}

Assistant:

void QTableWidget::setItem(int row, int column, QTableWidgetItem *item)
{
    Q_D(QTableWidget);
    if (item) {
        if (Q_UNLIKELY(item->view)) {
            qWarning("QTableWidget: cannot insert an item that is already owned by another QTableWidget");
        } else {
            item->view = this;
            d->tableModel()->setItem(row, column, item);
        }
    } else {
        delete takeItem(row, column);
    }
}